

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O0

void __thiscall
gpu::ColorSpaceFilters<unsigned_char>::sepia
          (ColorSpaceFilters<unsigned_char> *this,uchar *pixelR,uchar *pixelG,uchar *pixelB,
          uchar *pixelOutputR,uchar *pixelOutputG,uchar *pixelOutputB)

{
  float fVar1;
  float temp;
  float value;
  uchar *pixelOutputG_local;
  uchar *pixelOutputR_local;
  uchar *pixelB_local;
  uchar *pixelG_local;
  uchar *pixelR_local;
  ColorSpaceFilters<unsigned_char> *this_local;
  
  fVar1 = (float)*pixelB * 0.05 + (float)*pixelR * 0.6 + (float)*pixelG * 0.35;
  temp = fVar1 * 1.25;
  if (temp <= 255.0) {
    if (temp < 0.0) {
      temp = 0.0;
    }
  }
  else {
    temp = 255.0;
  }
  *pixelOutputR = (uchar)(int)temp;
  temp = fVar1 * 1.05;
  if (temp <= 255.0) {
    if (temp < 0.0) {
      temp = 0.0;
    }
  }
  else {
    temp = 255.0;
  }
  *pixelOutputG = (uchar)(int)temp;
  temp = fVar1 * 1.25;
  if (temp <= 255.0) {
    if (temp < 0.0) {
      temp = 0.0;
    }
  }
  else {
    temp = 255.0;
  }
  *pixelOutputB = (uchar)(int)temp;
  return;
}

Assistant:

FUNCTION_PREFIX void ColorSpaceFilters<T>::sepia(T &pixelR, T &pixelG,T &pixelB,T &pixelOutputR,
                                                     T &pixelOutputG,T &pixelOutputB)                       
    {
      /**
       * Filter can be implemented inplace 
       * BW filter is basically 0.6*R + 0.35*G + 0.5*B
       * sepia we basically add some in RedChannel, and siginficantly less in Green Channel
       * */
      float value = 0.6*pixelR + 0.35*pixelG + 0.05*pixelB;
      //pixelOutputR=pixelOutputG=pixelOutputB=value;

			float temp = 1.25 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputR = temp;

      temp = 1.05 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputG = temp;

      temp = 1.25 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputB = temp;
    }